

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

cmServerResponse * __thiscall
cmServerProtocol1::ProcessSetGlobalSettings
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmake *pcVar1;
  bool bVar2;
  Value *pVVar3;
  long lVar4;
  pointer key;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  boolValues;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string
            ((string *)local_130._M_pod_data,(string *)&kDEBUG_OUTPUT_KEY_abi_cxx11_);
  std::__cxx11::string::string(local_110,(string *)&kTRACE_KEY_abi_cxx11_);
  std::__cxx11::string::string(local_f0,(string *)&kTRACE_EXPAND_KEY_abi_cxx11_);
  std::__cxx11::string::string(local_d0,(string *)&kWARN_UNINITIALIZED_KEY_abi_cxx11_);
  std::__cxx11::string::string(local_b0,(string *)&kWARN_UNUSED_KEY_abi_cxx11_);
  std::__cxx11::string::string(local_90,(string *)&kWARN_UNUSED_CLI_KEY_abi_cxx11_);
  std::__cxx11::string::string(local_70,(string *)&kCHECK_SYSTEM_VARS_KEY_abi_cxx11_);
  __l._M_len = 7;
  __l._M_array = (iterator)&local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&boolValues,__l,(allocator_type *)&local_50);
  lVar4 = 0xc0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_130 + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  key = boolValues.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (key == boolValues.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar1 = (this->super_cmServerProtocol).m_CMakeInstance._M_t.
               super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
               super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
               super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
      local_130._8_8_ = 0;
      local_118 = std::
                  _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1164:11)>
                  ::_M_invoke;
      local_120 = std::
                  _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1164:11)>
                  ::_M_manager;
      local_130._M_unused._M_object = pcVar1;
      setBool(request,&kDEBUG_OUTPUT_KEY_abi_cxx11_,(function<void_(bool)> *)&local_130);
      std::_Function_base::~_Function_base((_Function_base *)&local_130);
      local_130._8_8_ = 0;
      local_118 = std::
                  _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1165:32)>
                  ::_M_invoke;
      local_120 = std::
                  _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1165:32)>
                  ::_M_manager;
      local_130._M_unused._M_object = pcVar1;
      setBool(request,&kTRACE_KEY_abi_cxx11_,(function<void_(bool)> *)&local_130);
      std::_Function_base::~_Function_base((_Function_base *)&local_130);
      local_130._8_8_ = 0;
      local_118 = std::
                  _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1166:39)>
                  ::_M_invoke;
      local_120 = std::
                  _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1166:39)>
                  ::_M_manager;
      local_130._M_unused._M_object = pcVar1;
      setBool(request,&kTRACE_EXPAND_KEY_abi_cxx11_,(function<void_(bool)> *)&local_130);
      std::_Function_base::~_Function_base((_Function_base *)&local_130);
      local_130._8_8_ = 0;
      local_118 = std::
                  _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1168:11)>
                  ::_M_invoke;
      local_120 = std::
                  _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1168:11)>
                  ::_M_manager;
      local_130._M_unused._M_object = pcVar1;
      setBool(request,&kWARN_UNINITIALIZED_KEY_abi_cxx11_,(function<void_(bool)> *)&local_130);
      std::_Function_base::~_Function_base((_Function_base *)&local_130);
      local_130._8_8_ = 0;
      local_118 = std::
                  _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1169:38)>
                  ::_M_invoke;
      local_120 = std::
                  _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1169:38)>
                  ::_M_manager;
      local_130._M_unused._M_object = pcVar1;
      setBool(request,&kWARN_UNUSED_KEY_abi_cxx11_,(function<void_(bool)> *)&local_130);
      std::_Function_base::~_Function_base((_Function_base *)&local_130);
      local_130._8_8_ = 0;
      local_118 = std::
                  _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1171:11)>
                  ::_M_invoke;
      local_120 = std::
                  _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1171:11)>
                  ::_M_manager;
      local_130._M_unused._M_object = pcVar1;
      setBool(request,&kWARN_UNUSED_CLI_KEY_abi_cxx11_,(function<void_(bool)> *)&local_130);
      std::_Function_base::~_Function_base((_Function_base *)&local_130);
      local_130._8_8_ = 0;
      local_118 = std::
                  _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1173:11)>
                  ::_M_invoke;
      local_120 = std::
                  _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1173:11)>
                  ::_M_manager;
      local_130._M_unused._M_object = pcVar1;
      setBool(request,&kCHECK_SYSTEM_VARS_KEY_abi_cxx11_,(function<void_(bool)> *)&local_130);
      std::_Function_base::~_Function_base((_Function_base *)&local_130);
      Json::Value::Value((Value *)&local_130,nullValue);
      cmServerRequest::Reply(__return_storage_ptr__,request,(Value *)&local_130);
      Json::Value::~Value((Value *)&local_130);
LAB_0043186d:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&boolValues);
      return __return_storage_ptr__;
    }
    pVVar3 = Json::Value::operator[](&request->Data,key);
    bVar2 = Json::Value::isNull(pVVar3);
    if (!bVar2) {
      pVVar3 = Json::Value::operator[](&request->Data,key);
      bVar2 = Json::Value::isBool(pVVar3);
      if (!bVar2) {
        std::operator+(&local_50,"\"",key);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_130,&local_50,"\" must be unset or a bool value.");
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&local_130);
        std::__cxx11::string::~string((string *)local_130._M_pod_data);
        std::__cxx11::string::~string((string *)&local_50);
        goto LAB_0043186d;
      }
    }
    key = key + 1;
  } while( true );
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessSetGlobalSettings(
  const cmServerRequest& request)
{
  const std::vector<std::string> boolValues = {
    kDEBUG_OUTPUT_KEY,       kTRACE_KEY,       kTRACE_EXPAND_KEY,
    kWARN_UNINITIALIZED_KEY, kWARN_UNUSED_KEY, kWARN_UNUSED_CLI_KEY,
    kCHECK_SYSTEM_VARS_KEY
  };
  for (const auto& i : boolValues) {
    if (!request.Data[i].isNull() && !request.Data[i].isBool()) {
      return request.ReportError("\"" + i +
                                 "\" must be unset or a bool value.");
    }
  }

  cmake* cm = this->CMakeInstance();

  setBool(request, kDEBUG_OUTPUT_KEY,
          [cm](bool e) { cm->SetDebugOutputOn(e); });
  setBool(request, kTRACE_KEY, [cm](bool e) { cm->SetTrace(e); });
  setBool(request, kTRACE_EXPAND_KEY, [cm](bool e) { cm->SetTraceExpand(e); });
  setBool(request, kWARN_UNINITIALIZED_KEY,
          [cm](bool e) { cm->SetWarnUninitialized(e); });
  setBool(request, kWARN_UNUSED_KEY, [cm](bool e) { cm->SetWarnUnused(e); });
  setBool(request, kWARN_UNUSED_CLI_KEY,
          [cm](bool e) { cm->SetWarnUnusedCli(e); });
  setBool(request, kCHECK_SYSTEM_VARS_KEY,
          [cm](bool e) { cm->SetCheckSystemVars(e); });

  return request.Reply(Json::Value());
}